

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

int __thiscall
soplex::CLUFactor<double>::solveLleft
          (CLUFactor<double> *this,double eps,double *vec,int *nonz,int rn)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  double *pdVar10;
  int in_ECX;
  int *in_RDX;
  int *piVar11;
  long in_RSI;
  long in_RDI;
  int m;
  int *last;
  int *rperm;
  int *rorig;
  int *rbeg;
  int *idx;
  int *ridx;
  double *val;
  double *rval;
  double y;
  double x;
  int r;
  int n;
  int k;
  int j;
  int i;
  double in_stack_ffffffffffffff58;
  double in_stack_ffffffffffffff60;
  int *local_88;
  int *local_68;
  double *local_58;
  int local_34;
  int local_2c;
  int local_28;
  int local_24;
  int *local_20;
  long local_18;
  
  lVar5 = *(long *)(in_RDI + 0xc0);
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  pdVar10 = std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x299595);
  lVar6 = *(long *)(in_RDI + 200);
  lVar7 = *(long *)(in_RDI + 0xd0);
  lVar8 = *(long *)(in_RDI + 0xd8);
  local_34 = 0;
  local_28 = 0;
  while (local_28 < local_24) {
    enQueueMax(local_20,&local_28,*(int *)(lVar8 + (long)local_20[local_28] * 4));
  }
  local_88 = local_20 + *(int *)(in_RDI + 4);
  while (0 < local_24) {
    local_28 = deQueueMax(local_20,&local_24);
    iVar3 = *(int *)(lVar7 + (long)local_28 * 4);
    dVar1 = *(double *)(local_18 + (long)iVar3 * 8);
    bVar9 = isNotZero<double,double>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    if (bVar9) {
      piVar11 = local_88 + -1;
      local_88[-1] = iVar3;
      local_34 = local_34 + 1;
      iVar4 = *(int *)(lVar6 + (long)iVar3 * 4);
      local_58 = pdVar10 + iVar4;
      local_68 = (int *)(lVar5 + (long)iVar4 * 4);
      local_2c = *(int *)(lVar6 + (long)(iVar3 + 1) * 4) - iVar4;
      while (local_88 = piVar11, 0 < local_2c) {
        iVar3 = *local_68;
        dVar2 = *(double *)(local_18 + (long)iVar3 * 8);
        if ((dVar2 != 0.0) || (NAN(dVar2))) {
          in_stack_ffffffffffffff60 = dVar2 - dVar1 * *local_58;
          if ((in_stack_ffffffffffffff60 == 0.0) && (!NAN(in_stack_ffffffffffffff60))) {
            in_stack_ffffffffffffff60 = 1e-100;
          }
          *(double *)(local_18 + (long)iVar3 * 8) = in_stack_ffffffffffffff60;
        }
        else {
          dVar2 = *local_58;
          bVar9 = isNotZero<double,double>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
          if (bVar9) {
            *(double *)(local_18 + (long)iVar3 * 8) = -dVar1 * dVar2;
            enQueueMax(local_20,&local_24,*(int *)(lVar8 + (long)iVar3 * 4));
          }
        }
        local_58 = local_58 + 1;
        local_68 = local_68 + 1;
        local_2c = local_2c + -1;
      }
    }
    else {
      *(undefined8 *)(local_18 + (long)iVar3 * 8) = 0;
    }
  }
  for (local_28 = 0; local_28 < local_34; local_28 = local_28 + 1) {
    *local_20 = *local_88;
    local_88 = local_88 + 1;
    local_20 = local_20 + 1;
  }
  return local_34;
}

Assistant:

int CLUFactor<R>::solveLleft(R eps, R* vec, int* nonz, int rn)
{
   int i, j, k, n;
   int r;
   R x, y;
   R* rval, *val;
   int* ridx, *idx;
   int* rbeg;
   int* rorig, *rperm;
   int* last;

   ridx  = l.ridx;
   rval  = l.rval.data();
   rbeg  = l.rbeg;
   rorig = l.rorig;
   rperm = l.rperm;
   n     = 0;

   i = l.firstUpdate - 1;
#ifndef SOPLEX_WITH_L_ROWS
#pragma warn "Not yet implemented, define SOPLEX_WITH_L_ROWS"
   R*   lval = l.val.data();
   int*    lidx = l.idx;
   int*    lrow = l.row;
   int*    lbeg = l.start;

   for(; i >= 0; --i)
   {
      k   = lbeg[i];
      val = &lval[k];
      idx = &lidx[k];
      x   = 0;

      for(j = lbeg[i + 1]; j > k; --j)
         x += vec[*idx++] * (*val++);

      vec[lrow[i]] -= x;
   }

#else

   /*  move rhsidx to a heap
    */
   for(i = 0; i < rn;)
      enQueueMax(nonz, &i, rperm[nonz[i]]);

   last = nonz + thedim;

   while(rn > 0)
   {
      i = deQueueMax(nonz, &rn);
      r = rorig[i];
      x = vec[r];

      if(isNotZero(x, eps))
      {
         *(--last) = r;
         n++;
         k = rbeg[r];
         j = rbeg[r + 1] - k;
         val = &rval[k];
         idx = &ridx[k];

         while(j-- > 0)
         {
            assert(l.rperm[*idx] < i);
            int m = *idx++;
            y = vec[m];

            if(y == 0)
            {
               y = -x * *val++;

               if(isNotZero(y, eps))
               {
                  vec[m] = y;
                  enQueueMax(nonz, &rn, rperm[m]);
               }
            }
            else
            {
               y -= x * *val++;
               vec[m] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
            }
         }
      }
      else
         vec[r] = 0;
   }

   for(i = 0; i < n; ++i)
      *nonz++ = *last++;

#endif

   return n;
}